

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# new_meshfile_operations.cpp
# Opt level: O2

int __thiscall MSH::mesh_file::scan_Nodes(mesh_file *this,fstream *mesh_file,string *line_buffer)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  int iVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  split_str_vec;
  pair<const_int,_MSH::node> local_68;
  is_any_ofF<char> local_48;
  
  while( true ) {
    bVar4 = std::operator!=(line_buffer,"EndNodes");
    if (!bVar4) {
      return 0;
    }
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)mesh_file,(string *)line_buffer);
    boost::algorithm::erase_all<std::__cxx11::string,char[2]>(line_buffer,(char (*) [2])0x15bf06);
    bVar4 = std::operator==(line_buffer,"$EndNodes");
    if (bVar4) break;
    iVar5 = check_read_state(mesh_file);
    if (iVar5 != 0) {
      return 1;
    }
    split_str_vec.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    split_str_vec.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    split_str_vec.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    boost::algorithm::is_any_of<char[2]>(&local_48,(char (*) [2])0x15e7f6);
    boost::algorithm::
    split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
              (&split_str_vec,line_buffer,&local_48,token_compress_off);
    boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF(&local_48);
    if ((long)split_str_vec.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)split_str_vec.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x80) {
      dVar1 = std::__cxx11::stod(split_str_vec.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 1,(size_t *)0x0);
      dVar2 = std::__cxx11::stod(split_str_vec.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 2,(size_t *)0x0);
      dVar3 = std::__cxx11::stod(split_str_vec.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 3,(size_t *)0x0);
      local_68.first =
           std::__cxx11::stoi(split_str_vec.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,(size_t *)0x0,10);
      local_68.second.x = dVar1;
      local_68.second.y = dVar2;
      local_68.second.z = dVar3;
      std::
      _Rb_tree<int,std::pair<int_const,MSH::node>,std::_Select1st<std::pair<int_const,MSH::node>>,std::less<int>,std::allocator<std::pair<int_const,MSH::node>>>
      ::_M_insert_unique<std::pair<int_const,MSH::node>>
                ((_Rb_tree<int,std::pair<int_const,MSH::node>,std::_Select1st<std::pair<int_const,MSH::node>>,std::less<int>,std::allocator<std::pair<int_const,MSH::node>>>
                  *)this,&local_68);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&split_str_vec);
  }
  return 0;
}

Assistant:

int MSH::mesh_file::scan_Nodes(std::fstream &mesh_file, std::string &line_buffer)
{
    while (line_buffer!="EndNodes")
    {
        getline(mesh_file,line_buffer);
        boost::erase_all(line_buffer, "\r");
        if (line_buffer=="$EndNodes")
            break;
        if (check_read_state(mesh_file))
            return EXIT_FAILURE;
        std::vector<std::string> split_str_vec;
        boost::split(split_str_vec, line_buffer, boost::is_any_of(" "));
        if (split_str_vec.size()==4)
        {
            node input_node;
            input_node.x = std::stod(split_str_vec[1]);
            input_node.y = std::stod(split_str_vec[2]);
            input_node.z = std::stod(split_str_vec[3]);
            nodes_map.insert({std::stoi(split_str_vec[0]),input_node});
        }
    }
    return EXIT_SUCCESS;
}